

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToString_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToString_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  key_type kVar3;
  key_type kVar4;
  Type type;
  value_type this_00;
  reference expression_text;
  value_type expected_predicate_value;
  size_type sVar5;
  value_type this_01;
  reference file;
  char *pcVar6;
  bool *success;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  StringIO stringio;
  string stringbuf;
  int i;
  TypeParam ht_out;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  key_equal *in_stack_fffffffffffffa18;
  int iVar7;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  char *in_stack_fffffffffffffa28;
  int line;
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffa30;
  Type in_stack_fffffffffffffa3c;
  AssertHelper *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa70;
  char *in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  AssertHelper *in_stack_fffffffffffffa90;
  value_type in_stack_fffffffffffffab0;
  string local_518 [48];
  key_type local_4e8;
  undefined1 local_4e1;
  AssertionResult local_4e0;
  string local_4d0 [24];
  value_type *in_stack_fffffffffffffb48;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb50;
  AssertionResult local_498 [2];
  Type local_474;
  value_type local_420;
  AssertionResult local_418;
  string local_408 [48];
  key_type local_3d8;
  undefined1 local_3d1;
  AssertionResult local_3d0 [2];
  key_type local_3ac;
  value_type local_358;
  AssertionResult local_350 [2];
  key_type local_32c;
  value_type local_2d8;
  AssertionResult local_2d0;
  string local_2c0 [55];
  undefined1 local_289;
  AssertionResult local_288;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_278;
  Hasher local_268;
  Hasher local_25c;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_250;
  string local_1b8 [55];
  undefined1 local_181;
  AssertionResult local_180;
  StringIO local_170;
  string local_168;
  key_type local_148;
  key_type local_144;
  value_type local_e4;
  int local_dc;
  key_type local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  Hasher local_b8;
  Hasher local_ac;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a0;
  
  bVar1 = google::
          HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    Hasher::Hasher(&local_ac,0);
    Hasher::Hasher(&local_b8,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              (in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28,
               (hasher *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               in_stack_fffffffffffffa18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
    local_d8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                      (key_type *)in_stack_fffffffffffffa08);
    for (local_dc = 1; local_dc < 100; local_dc = local_dc + 1) {
      in_stack_fffffffffffffab0 =
           HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffa08,0);
      local_e4 = in_stack_fffffffffffffab0;
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    }
    kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    local_144 = kVar2;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
            (key_type *)in_stack_fffffffffffffa08);
    kVar3 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    local_148 = kVar3;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
            (key_type *)in_stack_fffffffffffffa08);
    std::__cxx11::string::string((string *)&local_168);
    StringIO::StringIO(&local_170,&local_168);
    local_181 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::
                serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                          (&local_a0,&local_170);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (bool *)in_stack_fffffffffffffa08,(type *)0xf74cea);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                 in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                 (char *)in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffa90,
                 (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      std::__cxx11::string::~string(local_1b8);
      testing::Message::~Message((Message *)0xf74dc6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf74e5d);
    Hasher::Hasher(&local_25c,0);
    Hasher::Hasher(&local_268,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_278,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              (in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28,
               (hasher *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               in_stack_fffffffffffffa18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_278);
    local_289 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::
                unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                          (&local_250,&local_170);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (bool *)in_stack_fffffffffffffa08,(type *)0xf74f11);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                 in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                 (char *)in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffa90,
                 (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      std::__cxx11::string::~string(local_2c0);
      testing::Message::~Message((Message *)0xf75025);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf750bc);
    this_00 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffa08,0);
    local_2d8 = this_00;
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    local_32c = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffab0,(key_type *)CONCAT44(kVar2,kVar3));
    expression_text =
         google::
         sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)0xf7513d);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              (in_stack_fffffffffffffa28,
               (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (pair<const_int,_int> *)in_stack_fffffffffffffa18,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10)
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa40);
      in_stack_fffffffffffffa78 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf751b4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                 (char *)in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(kVar4,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::Message::~Message((Message *)0xf75211);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf75282);
    expected_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffa08,0);
    local_358 = expected_predicate_value;
    local_3ac = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                            (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffab0,(key_type *)CONCAT44(kVar2,kVar3));
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf752f7);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              (in_stack_fffffffffffffa28,
               (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (pair<const_int,_int> *)in_stack_fffffffffffffa18,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10)
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_350);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa40);
      testing::AssertionResult::failure_message((AssertionResult *)0xf7536e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                 (char *)in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(kVar4,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::Message::~Message((Message *)0xf753cb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7543c);
    local_3d8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                            (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    sVar5 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                    (key_type *)in_stack_fffffffffffffa08);
    local_3d1 = sVar5 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (bool *)in_stack_fffffffffffffa08,(type *)0xf754a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,in_stack_fffffffffffffa88),
                 (char *)expression_text,in_stack_fffffffffffffa78,(char *)expected_predicate_value)
      ;
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                 (char *)in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(kVar4,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      std::__cxx11::string::~string(local_408);
      testing::Message::~Message((Message *)0xf75579);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf75610);
    this_01 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffa08,0);
    local_420 = this_01;
    type = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                       (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
    local_474 = type;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffab0,(key_type *)CONCAT44(kVar2,kVar3));
    file = google::
           sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xf75685);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              (in_stack_fffffffffffffa28,
               (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (pair<const_int,_int> *)in_stack_fffffffffffffa18,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10)
              );
    line = (int)((ulong)in_stack_fffffffffffffa28 >> 0x20);
    iVar7 = (int)((ulong)in_stack_fffffffffffffa18 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_418);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0xf756fc);
      line = (int)((ulong)pcVar6 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,type,(char *)file,line,
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(kVar4,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::Message::~Message((Message *)0xf75759);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf757ca);
    kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),iVar7);
    sVar5 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                    (key_type *)in_stack_fffffffffffffa08);
    iVar7 = (int)(sVar5 >> 0x20);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (bool *)in_stack_fffffffffffffa08,(type *)0xf75832);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_498);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,in_stack_fffffffffffffa88),
                 (char *)expression_text,in_stack_fffffffffffffa78,(char *)expected_predicate_value)
      ;
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,type,(char *)file,line,
                 (char *)CONCAT44(kVar2,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(kVar4,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      std::__cxx11::string::~string(local_4d0);
      testing::Message::~Message((Message *)0xf75907);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf7599e);
    kVar3 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(kVar2,in_stack_fffffffffffffa20),iVar7);
    local_4e8 = kVar3;
    success = (bool *)google::
                      BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(kVar3,in_stack_fffffffffffffa10),
                              (key_type *)in_stack_fffffffffffffa08);
    local_4e1 = success == (bool *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(kVar3,in_stack_fffffffffffffa10),success,(type *)0xf75a04
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,in_stack_fffffffffffffa88),
                 (char *)expression_text,in_stack_fffffffffffffa78,(char *)expected_predicate_value)
      ;
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,type,(char *)file,line,
                 (char *)CONCAT44(kVar2,in_stack_fffffffffffffa20));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(kVar4,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(kVar3,in_stack_fffffffffffffa10));
      std::__cxx11::string::~string(local_518);
      testing::Message::~Message((Message *)0xf75ad9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf75b6d);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf75b7a);
    std::__cxx11::string::~string((string *)&local_168);
    google::
    HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf75b94);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToString) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  string stringbuf;
  StringIO stringio(&stringbuf);
  EXPECT_TRUE(
      ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));

  TypeParam ht_in;
  EXPECT_TRUE(
      ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}